

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  char *pcVar1;
  ushort *puVar2;
  BYTE *srcPtr;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort *puVar12;
  byte *pbVar13;
  ushort *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ushort *puVar19;
  ushort *puVar20;
  BYTE *dstPtr;
  BYTE *s_1;
  long lVar21;
  char *pcVar22;
  char *pcVar23;
  BYTE *d_1;
  char *pcVar24;
  BYTE *d;
  char *pcVar25;
  ulong uVar26;
  int iVar27;
  BYTE *s;
  ushort *puVar28;
  ushort *puVar29;
  
  iVar27 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar27 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar2 = (ushort *)(source + compressedSize);
      lVar17 = (long)maxOutputSize;
      puVar20 = (ushort *)(source + (long)compressedSize + -0x10);
      iVar27 = (int)source;
      if (0x3f < maxOutputSize) {
        lVar16 = 0;
LAB_00109f97:
        pcVar25 = dest + lVar16;
        puVar29 = (ushort *)((long)source + 1);
        bVar4 = (byte)*(ushort *)source;
        uVar9 = (uint)bVar4;
        uVar26 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          if ((ushort *)((long)puVar2 - 0xfU) <= puVar29) goto LAB_0010a40b;
          puVar19 = (ushort *)((long)source + 2);
          uVar18 = 0;
          puVar14 = (ushort *)((long)source + 0x10);
          do {
            puVar28 = puVar29;
            puVar12 = puVar14;
            puVar29 = (ushort *)((long)puVar28 + 1);
            uVar18 = uVar18 + *(byte *)((long)puVar12 + -0xf);
            puVar19 = (ushort *)((long)puVar19 + 1);
            puVar14 = (ushort *)((long)puVar12 + 1);
          } while (puVar12 + -7 < (ushort *)((long)puVar2 - 0xfU) &&
                   *(byte *)((long)puVar12 + -0xf) == 0xff);
          uVar26 = (ulong)uVar18 + 0xf;
          if ((CARRY8((ulong)pcVar25,uVar26)) || ((ulong)-(long)puVar19 < uVar26)) {
            puVar29 = puVar12 + -7;
            goto LAB_0010a40b;
          }
          lVar15 = lVar16 + uVar26;
          if (dest + lVar17 + -0x20 < dest + lVar15) goto LAB_0010a2cb;
          puVar14 = (ushort *)((ulong)uVar18 + (long)puVar12 + 1);
          if (puVar2 + -0x10 < puVar14) {
            puVar29 = puVar12 + -7;
            goto LAB_0010a2cb;
          }
          lVar16 = 0;
          do {
            uVar7 = *(undefined8 *)((byte *)((long)puVar29 + lVar16) + 8);
            pcVar3 = pcVar25 + lVar16;
            *(undefined8 *)pcVar3 = *(undefined8 *)((long)puVar29 + lVar16);
            *(undefined8 *)(pcVar3 + 8) = uVar7;
            pbVar13 = (byte *)((long)puVar28 + lVar16 + 0x11);
            uVar7 = *(undefined8 *)(pbVar13 + 8);
            *(undefined8 *)(pcVar3 + 0x10) = *(undefined8 *)pbVar13;
            *(undefined8 *)(pcVar3 + 0x18) = uVar7;
            lVar16 = lVar16 + 0x20;
          } while (pcVar3 + 0x20 < dest + lVar15);
        }
        else {
          lVar15 = lVar16 + uVar26;
          if ((ushort *)((long)puVar2 - 0x11U) < puVar29) goto LAB_0010a2cb;
          uVar7 = *(undefined8 *)((long)source + 9);
          *(undefined8 *)pcVar25 = *(undefined8 *)puVar29;
          *(undefined8 *)(pcVar25 + 8) = uVar7;
          puVar14 = (ushort *)(uVar26 + (long)puVar29);
        }
        dstPtr = (BYTE *)(dest + lVar15);
        uVar6 = *puVar14;
        uVar26 = (ulong)uVar6;
        uVar18 = (uint)uVar6;
        source = (char *)(puVar14 + 1);
        lVar21 = lVar15 - uVar26;
        srcPtr = (BYTE *)(dest + lVar21);
        uVar11 = (ulong)(bVar4 & 0xf);
        if (uVar11 == 0xf) {
          puVar29 = (ushort *)source;
          if (lVar21 < -0x10000) goto LAB_0010a40b;
          uVar9 = 0;
          puVar14 = (ushort *)source;
          do {
            source = (char *)((long)puVar14 + 1);
            puVar29 = (ushort *)source;
            if (puVar2 + -2 <= source) goto LAB_0010a40b;
            uVar8 = *puVar14;
            uVar9 = uVar9 + (byte)uVar8;
            puVar14 = (ushort *)source;
          } while ((byte)uVar8 == 0xff);
          uVar10 = (ulong)uVar9;
          if ((BYTE *)(-0x10 - uVar10) < dstPtr) goto LAB_0010a40b;
          uVar11 = uVar10 + 0x13;
          if (dest + lVar17 + -0x40 <= dstPtr + uVar10 + 0x13) goto LAB_0010a357;
        }
        else {
          lVar16 = lVar15 + uVar11 + 4;
          uVar11 = uVar11 + 4;
          if (dest + lVar17 + -0x40 <= dest + lVar16) goto LAB_0010a357;
          if (7 < uVar6) {
            *(undefined8 *)dstPtr = *(undefined8 *)srcPtr;
            *(undefined8 *)(dstPtr + 8) = *(undefined8 *)(srcPtr + 8);
            *(undefined2 *)(dstPtr + 0x10) = *(undefined2 *)(srcPtr + 0x10);
            goto LAB_00109f97;
          }
        }
        puVar29 = (ushort *)source;
        if (lVar21 < -0x10000) goto LAB_0010a40b;
        lVar16 = lVar15 + uVar11;
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset(dstPtr,srcPtr,(BYTE *)(dest + lVar16),uVar26);
        }
        else {
          do {
            uVar7 = *(undefined8 *)(dstPtr + -uVar26 + 8);
            *(undefined8 *)dstPtr = *(undefined8 *)(dstPtr + -uVar26);
            *(undefined8 *)(dstPtr + 8) = uVar7;
            uVar7 = *(undefined8 *)(dstPtr + -uVar26 + 0x10 + 8);
            *(undefined8 *)(dstPtr + 0x10) = *(undefined8 *)(dstPtr + -uVar26 + 0x10);
            *(undefined8 *)(dstPtr + 0x18) = uVar7;
            dstPtr = dstPtr + 0x20;
          } while (dstPtr < dest + lVar16);
        }
        goto LAB_00109f97;
      }
      lVar16 = 0;
LAB_0010a3d3:
      bVar4 = (byte)*(ushort *)source;
      puVar29 = (ushort *)((long)source + 1);
      lVar15 = lVar16;
      while( true ) {
        pcVar25 = dest + lVar15;
        uVar9 = (uint)bVar4;
        if (bVar4 >> 4 == 0xf) break;
        uVar26 = (ulong)(uint)(bVar4 >> 4);
        if ((puVar20 <= puVar29) || (dest + lVar17 + -0x20 < pcVar25)) goto LAB_0010a2c8;
        uVar7 = *(undefined8 *)(puVar29 + 4);
        *(undefined8 *)pcVar25 = *(undefined8 *)puVar29;
        *(undefined8 *)(pcVar25 + 8) = uVar7;
        lVar15 = lVar16 + uVar26;
        uVar11 = (ulong)(uVar9 & 0xf);
        source = (char *)((ushort *)((long)puVar29 + uVar26) + 1);
        uVar6 = *(ushort *)((long)puVar29 + uVar26);
        uVar18 = (uint)uVar6;
        lVar21 = lVar15 - (ulong)uVar6;
        if (((uVar9 & 0xf) == 0xf) || (uVar6 < 8)) goto LAB_0010a316;
        *(undefined8 *)(dest + lVar15) = *(undefined8 *)(dest + lVar21);
        *(undefined8 *)(dest + lVar15 + 8) = *(undefined8 *)(dest + lVar21 + 8);
        *(undefined2 *)(dest + lVar15 + 0x10) = *(undefined2 *)(dest + lVar21 + 0x10);
        lVar16 = lVar15 + uVar11 + 4;
        lVar15 = uVar11 + lVar15 + 4;
        bVar4 = *(byte *)((long)puVar29 + uVar26 + 2);
        puVar29 = (ushort *)((long)puVar29 + uVar26 + 3);
      }
      if ((ushort *)((long)puVar2 - 0xfU) <= puVar29) goto LAB_0010a40b;
      pbVar13 = (byte *)((long)puVar29 + 1);
      uVar18 = 0;
      do {
        uVar6 = *puVar29;
        puVar29 = (ushort *)((long)puVar29 + 1);
        uVar18 = uVar18 + (byte)uVar6;
        pbVar13 = pbVar13 + 1;
      } while (puVar29 < (ushort *)((long)puVar2 - 0xfU) && (byte)uVar6 == 0xff);
      uVar26 = (ulong)uVar18 + 0xf;
      if ((CARRY8((ulong)pcVar25,uVar26)) || ((ulong)-(long)pbVar13 < uVar26)) goto LAB_0010a40b;
LAB_0010a2c8:
      lVar15 = lVar16 + uVar26;
LAB_0010a2cb:
      puVar14 = (ushort *)((long)puVar29 + uVar26);
      if ((dest + lVar15 <= dest + lVar17 + -0xc) && (puVar14 <= puVar2 + -4)) {
        do {
          *(undefined8 *)pcVar25 = *(undefined8 *)puVar29;
          pcVar25 = pcVar25 + 8;
          puVar29 = puVar29 + 4;
        } while (pcVar25 < dest + lVar15);
        uVar18 = (uint)*puVar14;
        source = (char *)(puVar14 + 1);
        lVar21 = lVar15 - (ulong)*puVar14;
        uVar11 = (ulong)(uVar9 & 0xf);
LAB_0010a316:
        if ((int)uVar11 == 0xf) {
          uVar9 = 0;
          do {
            puVar29 = (ushort *)source;
            source = (char *)((long)puVar29 + 1);
            if (puVar2 + -2 <= source) goto LAB_0010a408;
            uVar9 = uVar9 + (byte)*puVar29;
          } while ((byte)*puVar29 == 0xff);
          uVar11 = (ulong)uVar9 + 0xf;
          if (CARRY8((ulong)(dest + lVar15),uVar11)) {
LAB_0010a408:
            puVar29 = (ushort *)((long)puVar29 + 1);
            goto LAB_0010a40b;
          }
        }
        uVar11 = uVar11 + 4;
LAB_0010a357:
        puVar29 = (ushort *)source;
        if (lVar21 < -0x10000) goto LAB_0010a40b;
        pcVar25 = dest + lVar15;
        pcVar22 = dest + lVar21;
        lVar16 = lVar15 + uVar11;
        pcVar3 = dest + lVar16;
        if (uVar18 < 8) {
          pcVar25[0] = '\0';
          pcVar25[1] = '\0';
          pcVar25[2] = '\0';
          pcVar25[3] = '\0';
          *pcVar25 = *pcVar22;
          pcVar25[1] = pcVar22[1];
          pcVar25[2] = pcVar22[2];
          pcVar25[3] = pcVar22[3];
          uVar26 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar18 << 2));
          *(undefined4 *)(pcVar25 + 4) = *(undefined4 *)(pcVar22 + uVar26);
          pcVar22 = pcVar22 + (uVar26 - (long)*(int *)((long)dec64table + (ulong)(uVar18 << 2)));
        }
        else {
          *(undefined8 *)pcVar25 = *(undefined8 *)pcVar22;
          pcVar22 = pcVar22 + 8;
        }
        pcVar1 = pcVar25 + 8;
        if (dest + lVar17 + -0xc < pcVar3) {
          if (dest + lVar17 + -5 < pcVar3) goto LAB_0010a40b;
          pcVar25 = dest + lVar17 + -7;
          pcVar23 = pcVar22;
          pcVar24 = pcVar1;
          if (pcVar1 < pcVar25) {
            do {
              *(undefined8 *)pcVar24 = *(undefined8 *)pcVar23;
              pcVar24 = pcVar24 + 8;
              pcVar23 = pcVar23 + 8;
            } while (pcVar24 < pcVar25);
            pcVar22 = pcVar22 + ((long)pcVar25 - (long)pcVar1);
            pcVar1 = pcVar25;
          }
          for (; pcVar1 < pcVar3; pcVar1 = pcVar1 + 1) {
            cVar5 = *pcVar22;
            pcVar22 = pcVar22 + 1;
            *pcVar1 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar1 = *(undefined8 *)pcVar22;
          if (0x10 < uVar11) {
            pcVar25 = pcVar25 + 0x10;
            do {
              pcVar22 = pcVar22 + 8;
              *(undefined8 *)pcVar25 = *(undefined8 *)pcVar22;
              pcVar25 = pcVar25 + 8;
            } while (pcVar25 < pcVar3);
          }
        }
        goto LAB_0010a3d3;
      }
      if ((puVar14 == puVar2) && (lVar15 <= lVar17)) {
        memmove(pcVar25,puVar29,uVar26);
        return ((int)pcVar25 + (int)uVar26) - (int)dest;
      }
LAB_0010a40b:
      iVar27 = ~(uint)puVar29 + iVar27;
    }
  }
  return iVar27;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}